

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FmaCaseInstance::compare
          (FmaCaseInstance *this,void **inputs,void **outputs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  pointer pSVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  FloatFormat *this_00;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  ScopedRoundingMode tmp_ctx_;
  double local_248;
  double local_240;
  Interval ib;
  Interval ia;
  Interval local_1e8;
  Interval ic;
  Interval ref;
  Interval local_120;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  double local_e8;
  undefined8 uStack_e0;
  double local_d8;
  undefined8 uStack_d0;
  Interval local_c0;
  FloatFormat local_a8 [3];
  
  pSVar6 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = *(int *)((long)&(pSVar6->varType).m_data + 4);
  uVar11 = glu::getDataTypeScalarSize((pSVar6->varType).m_data.basic.type);
  this_00 = local_a8 + iVar5;
  uVar14 = 0;
  uVar13 = 0;
  if (0 < (int)uVar11) {
    uVar13 = (ulong)uVar11;
  }
  do {
    if (uVar13 == uVar14) {
LAB_007a5d2d:
      return (long)(int)uVar11 <= (long)uVar14;
    }
    fVar1 = *(float *)((long)*inputs + uVar14 * 4);
    fVar2 = *(float *)((long)inputs[1] + uVar14 * 4);
    fVar3 = *(float *)((long)inputs[2] + uVar14 * 4);
    fVar4 = *(float *)((long)*outputs + uVar14 * 4);
    tcu::FloatFormat::FloatFormat(local_a8,0,0,7,false,YES,MAYBE,MAYBE);
    tcu::FloatFormat::FloatFormat(local_a8 + 1,-0xd,0xd,9,false,MAYBE,MAYBE,MAYBE);
    tcu::FloatFormat::FloatFormat(local_a8 + 2,-0x7e,0x7f,0x17,true,MAYBE,YES,MAYBE);
    dVar16 = (double)fVar1;
    ib.m_hasNaN = NAN(fVar1);
    ib.m_lo = INFINITY;
    if (!ib.m_hasNaN) {
      ib.m_lo = dVar16;
    }
    ib.m_hi = -INFINITY;
    if (!ib.m_hasNaN) {
      ib.m_hi = dVar16;
    }
    tcu::FloatFormat::convert(&ia,this_00,&ib);
    ic.m_hasNaN = NAN(fVar2);
    ic.m_lo = INFINITY;
    ic.m_hi = -INFINITY;
    if (!ic.m_hasNaN) {
      ic.m_lo = (double)fVar2;
      ic.m_hi = ic.m_lo;
    }
    tcu::FloatFormat::convert(&ib,this_00,&ic);
    local_1e8.m_hasNaN = NAN(fVar3);
    local_1e8.m_lo = INFINITY;
    local_1e8.m_hi = -INFINITY;
    if (!local_1e8.m_hasNaN) {
      local_1e8.m_lo = (double)fVar3;
      local_1e8.m_hi = local_1e8.m_lo;
    }
    tcu::FloatFormat::convert(&ic,this_00,&local_1e8);
    local_1e8.m_hasNaN = false;
    local_1e8.m_lo = INFINITY;
    local_1e8.m_hi = -INFINITY;
    tmp_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar23 = ia.m_lo;
    dVar16 = ib.m_lo;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar23 = dVar23 * dVar16;
    bVar10 = NAN(dVar23);
    dVar16 = -INFINITY;
    if (!bVar10) {
      dVar16 = dVar23;
    }
    dVar22 = INFINITY;
    if (!bVar10) {
      dVar22 = dVar23;
    }
    dVar17 = ia.m_lo * ib.m_lo;
    dVar23 = -INFINITY;
    dVar19 = INFINITY;
    if (!NAN(dVar17)) {
      dVar23 = dVar17;
      dVar19 = dVar17;
    }
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
    tmp_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar24 = ia.m_lo;
    dVar27 = ib.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar24 = dVar24 * dVar27;
    dVar27 = -INFINITY;
    if (!NAN(dVar24)) {
      dVar27 = dVar24;
    }
    local_e8 = ia.m_lo * ib.m_hi;
    local_d8 = INFINITY;
    if (!NAN(local_e8)) {
      local_d8 = local_e8;
    }
    uStack_e0 = 0;
    uStack_d0 = 0;
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
    tmp_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar25 = ia.m_hi;
    dVar20 = ib.m_lo;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar25 = dVar25 * dVar20;
    dVar20 = -INFINITY;
    if (!NAN(dVar25)) {
      dVar20 = dVar25;
    }
    local_108 = ia.m_hi * ib.m_lo;
    local_f8 = INFINITY;
    if (!NAN(local_108)) {
      local_f8 = local_108;
    }
    uStack_100 = 0;
    uStack_f0 = 0;
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
    tmp_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar26 = ia.m_hi;
    dVar18 = ib.m_hi;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    bVar7 = NAN(local_108);
    bVar8 = NAN(local_e8);
    dVar26 = dVar26 * dVar18;
    bVar9 = NAN(dVar26);
    dVar18 = -INFINITY;
    if (!bVar9) {
      dVar18 = dVar26;
    }
    dVar21 = INFINITY;
    if (!bVar9) {
      dVar21 = dVar26;
    }
    dVar26 = (double)(~-(ulong)(dVar22 <= dVar19) & (ulong)dVar19 |
                     (ulong)dVar22 & -(ulong)(dVar22 <= dVar19));
    dVar28 = (double)(~-(ulong)(dVar23 <= dVar16) & (ulong)dVar23 |
                     (ulong)dVar16 & -(ulong)(dVar23 <= dVar16));
    dVar16 = (double)(-(ulong)NAN(dVar24) & 0x7ff0000000000000 |
                     ~-(ulong)NAN(dVar24) & (ulong)dVar24);
    dVar23 = (double)(~-(ulong)NAN(local_e8) & (ulong)local_e8 |
                     -(ulong)NAN(local_e8) & 0xfff0000000000000);
    uVar15 = -(ulong)(dVar16 <= local_d8);
    dVar30 = (double)(~uVar15 & (ulong)local_d8 | uVar15 & (ulong)dVar16);
    uVar15 = -(ulong)(dVar23 <= dVar27);
    dVar22 = (double)(~uVar15 & (ulong)dVar23 | (ulong)dVar27 & uVar15);
    dVar23 = (double)(-(ulong)NAN(dVar25) & 0x7ff0000000000000 |
                     ~-(ulong)NAN(dVar25) & (ulong)dVar25);
    dVar16 = (double)(~-(ulong)NAN(local_108) & (ulong)local_108 |
                     -(ulong)NAN(local_108) & 0xfff0000000000000);
    uVar15 = -(ulong)(dVar23 <= local_f8);
    dVar29 = (double)(~uVar15 & (ulong)local_f8 | uVar15 & (ulong)dVar23);
    uVar15 = -(ulong)(dVar16 <= dVar20);
    dVar27 = ia.m_hi * ib.m_hi;
    dVar16 = (double)(~uVar15 & (ulong)dVar16 | (ulong)dVar20 & uVar15);
    dVar23 = INFINITY;
    dVar19 = -INFINITY;
    if (!NAN(dVar27)) {
      dVar23 = dVar27;
      dVar19 = dVar27;
    }
    dVar20 = (double)(~-(ulong)(dVar21 <= dVar23) & (ulong)dVar23 |
                     (ulong)dVar21 & -(ulong)(dVar21 <= dVar23));
    dVar23 = (double)(~-(ulong)(dVar19 <= dVar18) & (ulong)dVar19 |
                     (ulong)dVar18 & -(ulong)(dVar19 <= dVar18));
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
    uVar15 = -(ulong)(dVar26 <= dVar30);
    dVar19 = (double)(~uVar15 & (ulong)dVar30 | uVar15 & (ulong)dVar26);
    uVar15 = -(ulong)(dVar22 <= dVar28);
    dVar22 = (double)(~uVar15 & (ulong)dVar22 | uVar15 & (ulong)dVar28);
    uVar15 = -(ulong)(dVar19 <= dVar29);
    dVar19 = (double)(~uVar15 & (ulong)dVar29 | uVar15 & (ulong)dVar19);
    uVar15 = -(ulong)(dVar16 <= dVar22);
    dVar16 = (double)(~uVar15 & (ulong)dVar16 | uVar15 & (ulong)dVar22);
    local_120.m_hasNaN =
         (bVar9 || NAN(dVar27)) ||
         (((bVar8 || NAN(dVar25)) || bVar7) || ((bVar10 || NAN(dVar17)) || NAN(dVar24)));
    uVar15 = -(ulong)(dVar19 <= dVar20);
    local_120.m_lo = (double)(uVar15 & (ulong)dVar19 | ~uVar15 & (ulong)dVar20);
    uVar15 = -(ulong)(dVar23 <= dVar16);
    local_120.m_hi = (double)(uVar15 & (ulong)dVar16 | ~uVar15 & (ulong)dVar23);
    bVar10 = false;
    if ((ia.m_lo != -INFINITY) && (bVar10 = false, ia.m_hi != INFINITY)) {
      bVar10 = ib.m_hi != INFINITY && ib.m_lo != -INFINITY;
    }
    tcu::FloatFormat::roundOut(&local_c0,this_00,&local_120,bVar10);
    tcu::FloatFormat::convert((Interval *)&tmp_ctx_,this_00,&local_c0);
    tmp_ctx_.m_oldMode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    dVar16 = ic.m_lo;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    dVar16 = dVar16 + local_248;
    local_1e8.m_hasNaN = NAN(dVar16);
    dVar23 = -INFINITY;
    if (!local_1e8.m_hasNaN) {
      dVar23 = dVar16;
    }
    dVar22 = INFINITY;
    if (!local_1e8.m_hasNaN) {
      dVar22 = dVar16;
    }
    dVar17 = ic.m_hi + local_240;
    dVar16 = -INFINITY;
    dVar19 = INFINITY;
    if (!NAN(dVar17)) {
      dVar16 = dVar17;
      dVar19 = dVar17;
    }
    local_1e8.m_hasNaN = local_1e8.m_hasNaN || NAN(dVar17);
    local_1e8.m_lo =
         (double)(~-(ulong)(dVar22 <= dVar19) & (ulong)dVar19 |
                 (ulong)dVar22 & -(ulong)(dVar22 <= dVar19));
    local_1e8.m_hi =
         (double)(~-(ulong)(dVar16 <= dVar23) & (ulong)dVar16 |
                 (ulong)dVar23 & -(ulong)(dVar16 <= dVar23));
    tcu::ScopedRoundingMode::~ScopedRoundingMode(&tmp_ctx_);
    bVar10 = false;
    if ((local_248 != -INFINITY) && (bVar10 = false, local_240 != INFINITY)) {
      bVar10 = ic.m_hi != INFINITY && ic.m_lo != -INFINITY;
    }
    tcu::FloatFormat::roundOut((Interval *)&tmp_ctx_,this_00,&local_1e8,bVar10);
    tcu::FloatFormat::convert(&ref,this_00,(Interval *)&tmp_ctx_);
    dVar16 = INFINITY;
    if (!NAN(fVar4)) {
      dVar16 = (double)fVar4;
    }
    dVar23 = -INFINITY;
    if (!NAN(fVar4)) {
      dVar23 = (double)fVar4;
    }
    if (((dVar16 < ref.m_lo) || (ref.m_hi < dVar23)) || ((NAN(fVar4) && (ref.m_hasNaN == false)))) {
      poVar12 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                "Expected [");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)uVar14);
      poVar12 = std::operator<<(poVar12,"] = ");
      tcu::operator<<(poVar12,&ref);
      goto LAB_007a5d2d;
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float			a			= ((const float*)inputs[0])[compNdx];
			const float			b			= ((const float*)inputs[1])[compNdx];
			const float			c			= ((const float*)inputs[2])[compNdx];
			const float			res			= ((const float*)outputs[0])[compNdx];
			const tcu::Interval	ref			= fma(precision, a, b, c);

			if (!ref.contains(res))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << ref;
				return false;
			}
		}

		return true;
	}